

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplerng.c
# Opt level: O3

int simplerng_poisson_large(double lambda)

{
  int iVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  if ((simplerng_poisson_large::old_lambda != lambda) ||
     (NAN(simplerng_poisson_large::old_lambda) || NAN(lambda))) {
    dVar3 = lambda * 3.0;
    if (dVar3 < 0.0) {
      dVar3 = sqrt(dVar3);
    }
    else {
      dVar3 = SQRT(dVar3);
    }
    simplerng_poisson_large::beta = 3.141592653589793 / dVar3;
    simplerng_poisson_large::alpha = simplerng_poisson_large::beta * lambda;
    dVar3 = log(-3.36 / lambda + 0.767);
    dVar4 = log(simplerng_poisson_large::beta);
    simplerng_poisson_large::k = (dVar3 - lambda) - dVar4;
    simplerng_poisson_large::old_lambda = lambda;
  }
  do {
    do {
      iVar1 = rand();
      dVar3 = simplerng_poisson_large::alpha;
      dVar4 = log((1.0 - (double)iVar1 * 4.656612873077393e-10) /
                  ((double)iVar1 * 4.656612873077393e-10));
      dVar4 = (dVar3 - dVar4) / simplerng_poisson_large::beta;
      dVar3 = floor(dVar4 + 0.5);
      iVar1 = (int)dVar3;
    } while (iVar1 < 0);
    iVar2 = rand();
    dVar4 = simplerng_poisson_large::alpha - dVar4 * simplerng_poisson_large::beta;
    dVar3 = exp(dVar4);
    dVar5 = log(((double)iVar2 * 4.656612873077393e-10) / ((dVar3 + 1.0) * (dVar3 + 1.0)));
    dVar3 = simplerng_poisson_large::k;
    dVar6 = log(lambda);
    dVar7 = simplerng_logfactorial(iVar1);
  } while ((dVar6 * (double)iVar1 + dVar3) - dVar7 < dVar5 + dVar4);
  return iVar1;
}

Assistant:

int simplerng_poisson_large(double lambda)
{
  /* "Rejection method PA" from "The Computer Generation of Poisson Random Variables" by A. C. Atkinson
     Journal of the Royal Statistical Society Series C (Applied Statistics) Vol. 28, No. 1. (1979)
     The article is on pages 29-35. The algorithm given here is on page 32. */
  static double beta, alpha, k;
  static double old_lambda = -999999.;

  if (lambda != old_lambda) {
    double c = 0.767 - 3.36/lambda;
    beta = PI/sqrt(3.0*lambda);
    alpha = beta*lambda;
    k = log(c) - lambda - log(beta);
    old_lambda = lambda;
  }

  for(;;) { /* forever */
    double u, x, v, y, temp, lhs, rhs;
    int n;

    u = simplerng_getuniform();
    x = (alpha - log((1.0 - u)/u))/beta;
    n = (int) floor(x + 0.5);
    if (n < 0) continue;

    v = simplerng_getuniform();
    y = alpha - beta*x;
    temp = 1.0 + exp(y);
    lhs = y + log(v/(temp*temp));
    rhs = k + n*log(lambda) - simplerng_logfactorial(n);
    if (lhs <= rhs) return n;
  }

}